

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O0

void __thiscall SM83::add_a_r(SM83 *this,u8 reg)

{
  u8 uVar1;
  ushort uVar2;
  u16 result;
  u8 reg_local;
  SM83 *this_local;
  
  uVar2 = (ushort)(this->field_0).field_1.a + (ushort)reg;
  uVar1 = (u8)uVar2;
  SetZeroFlag(this,uVar1 == '\0');
  SetNegateFlag(this,false);
  SetHalfCarryFlag(this,0xf < (byte)(((this->field_0).field_1.a & 0xf) + (reg & 0xf)));
  SetCarryFlag(this,0xff < uVar2);
  (this->field_0).field_1.a = uVar1;
  return;
}

Assistant:

void SM83::add_a_r(u8 reg) {
    u16 result = a + reg;

    SetZeroFlag(static_cast<u8>(result) == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag((a & 0xF) + (reg & 0xF) > 0xF);
    SetCarryFlag(result > 0xFF);

    a = static_cast<u8>(result);
}